

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

void X86_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  cs_mode cVar1;
  cs_detail *pcVar2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  int i;
  uint id_local;
  cs_insn *insn_local;
  cs_struct *h_local;
  
  uVar3 = insn_find(insns,0x1726,id,&h->insn_cache);
  uVar4 = (uint)uVar3;
  if (uVar4 == 0) {
    return;
  }
  insn->id = (uint)insns[(int)uVar4].mapid;
  if (h->detail == CS_OPT_OFF) {
    return;
  }
  pcVar2 = insn->detail;
  *(undefined4 *)(pcVar2->regs_read + 8) = *(undefined4 *)(insns[(int)uVar4].regs_use + 8);
  *(undefined8 *)pcVar2->regs_read = *(undefined8 *)insns[(int)uVar4].regs_use;
  uVar5 = count_positive(insns[(int)uVar4].regs_use);
  insn->detail->regs_read_count = (uint8_t)uVar5;
  if (id == 0x935) {
    if (h->mode == CS_MODE_64) {
      pcVar2 = insn->detail;
      *(undefined8 *)pcVar2->regs_write = *(undefined8 *)insns[(int)uVar4].regs_mod;
      *(undefined8 *)(pcVar2->regs_write + 8) = *(undefined8 *)(insns[(int)uVar4].regs_mod + 8);
      *(undefined4 *)(pcVar2->regs_write + 0x10) =
           *(undefined4 *)(insns[(int)uVar4].regs_mod + 0x10);
      uVar5 = count_positive(insns[(int)uVar4].regs_mod);
      insn->detail->regs_write_count = (uint8_t)uVar5;
    }
    else {
      insn->detail->regs_write[0] = '\x13';
      insn->detail->regs_write[1] = '\x18';
      insn->detail->regs_write_count = '\x02';
    }
  }
  else if (id == 0x936) {
    if (h->mode == CS_MODE_64) {
      pcVar2 = insn->detail;
      *(undefined8 *)pcVar2->regs_write = *(undefined8 *)insns[(int)uVar4].regs_mod;
      *(undefined8 *)(pcVar2->regs_write + 8) = *(undefined8 *)(insns[(int)uVar4].regs_mod + 8);
      *(undefined4 *)(pcVar2->regs_write + 0x10) =
           *(undefined4 *)(insns[(int)uVar4].regs_mod + 0x10);
      uVar5 = count_positive(insns[(int)uVar4].regs_mod);
      insn->detail->regs_write_count = (uint8_t)uVar5;
    }
    else {
      insn->detail->regs_write[0] = '\x13';
      insn->detail->regs_write[1] = '\x16';
      insn->detail->regs_write[2] = '\x18';
      insn->detail->regs_write_count = '\x03';
    }
  }
  else {
    pcVar2 = insn->detail;
    *(undefined8 *)pcVar2->regs_write = *(undefined8 *)insns[(int)uVar4].regs_mod;
    *(undefined8 *)(pcVar2->regs_write + 8) = *(undefined8 *)(insns[(int)uVar4].regs_mod + 8);
    *(undefined4 *)(pcVar2->regs_write + 0x10) = *(undefined4 *)(insns[(int)uVar4].regs_mod + 0x10);
    uVar5 = count_positive(insns[(int)uVar4].regs_mod);
    insn->detail->regs_write_count = (uint8_t)uVar5;
  }
  uVar5 = insn->id;
  if ((2 < uVar5 - 0x60) && (uVar5 != 100)) {
    if (uVar5 - 0x148 < 4) {
      if (h->mode == CS_MODE_16) {
        arr_replace(insn->detail->regs_read,insn->detail->regs_read_count,X86_REG_ESI,X86_REG_SI);
        arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_ESI,X86_REG_SI);
      }
      else if (h->mode == CS_MODE_64) {
        arr_replace(insn->detail->regs_read,insn->detail->regs_read_count,X86_REG_ESI,X86_REG_RSI);
        arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_ESI,X86_REG_RSI)
        ;
      }
      goto LAB_002076da;
    }
    if (uVar5 - 0x14c < 3) {
      cVar1 = h->mode;
      if (cVar1 == CS_MODE_16) {
        insn->detail->regs_read[0] = '\f';
        insn->detail->regs_read_count = '\x01';
        insn->detail->regs_write[0] = '\f';
        insn->detail->regs_write_count = '\x01';
      }
      else if (cVar1 == CS_MODE_32) {
        insn->detail->regs_read[0] = '\x16';
        insn->detail->regs_read_count = '\x01';
        insn->detail->regs_write[0] = '\x16';
        insn->detail->regs_write_count = '\x01';
      }
      else if (cVar1 == CS_MODE_64) {
        insn->detail->regs_read[0] = '&';
        insn->detail->regs_read_count = '\x01';
        insn->detail->regs_write[0] = '&';
        insn->detail->regs_write_count = '\x01';
      }
      if (insn->id != 0x14c) {
        insn->detail->regs_read[1] = '\x19';
        insn->detail->regs_read_count = '\x02';
      }
      goto LAB_002076da;
    }
    if (((1 < uVar5 - 0x1cf) && (uVar5 != 0x1d3)) && (uVar5 != 0x1d5)) {
      if (((uVar5 == 0x266) || (uVar5 - 0x268 < 2)) || (uVar5 - 0x29b < 4)) {
        if (h->mode == CS_MODE_16) {
          arr_replace(insn->detail->regs_read,insn->detail->regs_read_count,X86_REG_EDI,X86_REG_DI);
          arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_EDI,X86_REG_DI
                     );
        }
        else if (h->mode == CS_MODE_64) {
          arr_replace(insn->detail->regs_read,insn->detail->regs_read_count,X86_REG_EDI,X86_REG_RDI)
          ;
          arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_EDI,
                      X86_REG_RDI);
        }
      }
      goto LAB_002076da;
    }
  }
  if (h->mode == CS_MODE_16) {
    arr_replace(insn->detail->regs_read,insn->detail->regs_read_count,X86_REG_EDI,X86_REG_DI);
    arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_EDI,X86_REG_DI);
    arr_replace(insn->detail->regs_read,insn->detail->regs_read_count,X86_REG_ESI,X86_REG_SI);
    arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_ESI,X86_REG_SI);
  }
  else if (h->mode == CS_MODE_64) {
    arr_replace(insn->detail->regs_read,insn->detail->regs_read_count,X86_REG_EDI,X86_REG_RDI);
    arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_EDI,X86_REG_RDI);
    arr_replace(insn->detail->regs_read,insn->detail->regs_read_count,X86_REG_ESI,X86_REG_RSI);
    arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_ESI,X86_REG_RSI);
  }
LAB_002076da:
  *(undefined8 *)insn->detail->groups = *(undefined8 *)insns[(int)uVar4].groups;
  uVar5 = count_positive(insns[(int)uVar4].groups);
  insn->detail->groups_count = (uint8_t)uVar5;
  if (((insns[(int)uVar4].branch & 1U) != 0) || ((insns[(int)uVar4].indirect_branch & 1U) != 0)) {
    insn->detail->groups[insn->detail->groups_count] = '\x01';
    insn->detail->groups_count = insn->detail->groups_count + '\x01';
  }
  uVar3 = insns[(int)uVar4].id;
  if ((((uVar3 == 0x766) || (uVar3 == 0x768)) || (uVar3 == 0x76a)) &&
     (*(long *)((long)&insn->detail->field_6 + 0x38) == -0x4e)) {
    insn->detail->groups[insn->detail->groups_count] = '\x04';
    insn->detail->groups_count = insn->detail->groups_count + '\x01';
  }
  return;
}

Assistant:

void X86_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			// special cases when regs_write[] depends on arch
			switch(id) {
				default:
					memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
					insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					break;
				case X86_RDTSC:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_EDX;
						insn->detail->regs_write_count = 2;
					}
					break;
				case X86_RDTSCP:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_ECX;
						insn->detail->regs_write[2] = X86_REG_EDX;
						insn->detail->regs_write_count = 3;
					}
					break;
			}

			switch(insn->id) {
				default:
					break;

				case X86_INS_LOOP:
				case X86_INS_LOOPE:
				case X86_INS_LOOPNE:
					switch(h->mode) {
						default: break;
						case CS_MODE_16:
								 insn->detail->regs_read[0] = X86_REG_CX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_CX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_32:
								 insn->detail->regs_read[0] = X86_REG_ECX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_ECX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_64:
								 insn->detail->regs_read[0] = X86_REG_RCX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_RCX;
								 insn->detail->regs_write_count = 1;
								 break;
					}

					// LOOPE & LOOPNE also read EFLAGS
					if (insn->id != X86_INS_LOOP) {
						insn->detail->regs_read[1] = X86_REG_EFLAGS;
						insn->detail->regs_read_count = 2;
					}

					break;

				case X86_INS_LODSB:
				case X86_INS_LODSD:
				case X86_INS_LODSQ:
				case X86_INS_LODSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;

				case X86_INS_SCASB:
				case X86_INS_SCASW:
				case X86_INS_SCASQ:
				case X86_INS_STOSB:
				case X86_INS_STOSD:
				case X86_INS_STOSQ:
				case X86_INS_STOSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							break;
					}
					break;

				case X86_INS_CMPSB:
				case X86_INS_CMPSD:
				case X86_INS_CMPSQ:
				case X86_INS_CMPSW:
				case X86_INS_MOVSB:
				case X86_INS_MOVSW:
				case X86_INS_MOVSD:
				case X86_INS_MOVSQ:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;
			}

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = X86_GRP_JUMP;
				insn->detail->groups_count++;
			}

			switch (insns[i].id) {
				case X86_OUT8ir:
				case X86_OUT16ir:
				case X86_OUT32ir:
					if (insn->detail->x86.operands[0].imm == -78) {
						// Writing to port 0xb2 causes an SMI on most platforms
						// See: http://cs.gmu.edu/~tr-admin/papers/GMU-CS-TR-2011-8.pdf
						insn->detail->groups[insn->detail->groups_count] = X86_GRP_INT;
						insn->detail->groups_count++;
					}
					break;

				default:
					break;
			}
#endif
		}
	}
}